

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_>::Data
          (Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> *this,
          Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> *other)

{
  Span *pSVar1;
  Entry *pEVar2;
  Node<QGesture_*,_QHashDummyValue> *pNVar3;
  long lVar4;
  size_t sVar5;
  ulong uVar6;
  size_t sVar7;
  R RVar8;
  
  (this->ref).atomic._q_value.super___atomic_base<int>._M_i = 1;
  this->size = other->size;
  sVar5 = other->numBuckets;
  sVar7 = other->seed;
  this->numBuckets = other->numBuckets;
  this->seed = sVar7;
  this->spans = (Span *)0x0;
  RVar8 = allocateSpans(sVar5);
  this->spans = (Span *)RVar8.spans;
  if (RVar8.nSpans != 0) {
    lVar4 = 0;
    sVar5 = 0;
    do {
      pSVar1 = other->spans;
      sVar7 = 0;
      do {
        uVar6 = (ulong)pSVar1->offsets[sVar7 + lVar4];
        if (uVar6 != 0xff) {
          pEVar2 = pSVar1[sVar5].entries;
          pNVar3 = Span<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_>::insert
                             (this->spans + sVar5,sVar7);
          pNVar3->key = *(QGesture **)pEVar2[uVar6].storage.data;
        }
        sVar7 = sVar7 + 1;
      } while (sVar7 != 0x80);
      sVar5 = sVar5 + 1;
      lVar4 = lVar4 + 0x90;
    } while (sVar5 != RVar8.nSpans);
  }
  return;
}

Assistant:

Data(const Data &other) : size(other.size), numBuckets(other.numBuckets), seed(other.seed)
    {
        auto r = allocateSpans(numBuckets);
        spans = r.spans;
        reallocationHelper<false>(other, r.nSpans);
    }